

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifAig.c
# Opt level: O0

int Io_BlifEstimatePiNum(Io_BlifMan_t *p)

{
  bool bVar1;
  int iVar2;
  int local_24;
  int Counter;
  int fSpaces;
  int i;
  char *pCur;
  Io_BlifMan_t *p_local;
  
  local_24 = 0;
  for (Counter = 0; iVar2 = Vec_PtrSize(p->vInputs), Counter < iVar2; Counter = Counter + 1) {
    _fSpaces = (char *)Vec_PtrEntry(p->vInputs,Counter);
    bVar1 = false;
    for (; *_fSpaces != '\0'; _fSpaces = _fSpaces + 1) {
      iVar2 = Io_BlifCharIsSpace(*_fSpaces);
      if (iVar2 == 0) {
        bVar1 = false;
      }
      else {
        if (!bVar1) {
          local_24 = local_24 + 1;
        }
        bVar1 = true;
      }
    }
  }
  return local_24;
}

Assistant:

static int Io_BlifEstimatePiNum( Io_BlifMan_t * p )
{
    char * pCur;
    int i, fSpaces;
    int Counter = 0;
    Vec_PtrForEachEntry( char *, p->vInputs, pCur, i )
        for ( fSpaces = 0; *pCur; pCur++ )
        {
            if ( Io_BlifCharIsSpace(*pCur) )
            {
                if ( !fSpaces )
                    Counter++;
                fSpaces = 1;
            }
            else
                fSpaces = 0;
        }
    return Counter;
}